

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O0

S3DVertex * __thiscall irr::scene::SSkinMeshBuffer::getVertex(SSkinMeshBuffer *this,u32 index)

{
  int iVar1;
  array<irr::video::S3DVertex> *in_RDI;
  u32 in_stack_ffffffffffffffdc;
  S3DVertexTangents *local_8;
  
  iVar1 = *(int *)&in_RDI[0xc].m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1 == 1) {
    local_8 = (S3DVertexTangents *)
              core::array<irr::video::S3DVertex2TCoords>::operator[]
                        ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffffdc);
  }
  else if (iVar1 == 2) {
    local_8 = core::array<irr::video::S3DVertexTangents>::operator[]
                        ((array<irr::video::S3DVertexTangents> *)in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    local_8 = (S3DVertexTangents *)
              core::array<irr::video::S3DVertex>::operator[](in_RDI,in_stack_ffffffffffffffdc);
  }
  return &local_8->super_S3DVertex;
}

Assistant:

virtual video::S3DVertex *getVertex(u32 index)
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return (video::S3DVertex *)&Vertices_2TCoords[index];
		case video::EVT_TANGENTS:
			return (video::S3DVertex *)&Vertices_Tangents[index];
		default:
			return &Vertices_Standard[index];
		}
	}